

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

void __thiscall QCachedPainter::finish(QCachedPainter *this)

{
  bool bVar1;
  QPoint p;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *unaff_retaddr;
  QPainter *in_stack_00000008;
  pointer in_stack_ffffffffffffffd8;
  QRect *pm;
  QPixmap *this_00;
  
  this_00 = *(QPixmap **)(in_FS_OFFSET + 0x28);
  pm = in_RDI;
  std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::reset
            ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)in_RDI,
             in_stack_ffffffffffffffd8);
  if ((in_RDI[5].x2.m_i & 0x100) == 0) {
    *(undefined1 *)((long)&in_RDI[5].x2.m_i + 1) = 1;
    bVar1 = QRect::isNull(in_RDI);
    if (bVar1) {
      p = QRect::topLeft(*(QRect **)in_RDI);
      QPainter::drawPixmap((QPainter *)this_00,(QPoint *)p,(QPixmap *)pm);
    }
    else {
      QPainter::drawPixmap(in_stack_00000008,unaff_retaddr,this_00);
    }
  }
  if (*(QPixmap **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCachedPainter::finish()
{
    m_pixmapPainter.reset();
    if (!m_pixmapDrawn) {
        m_pixmapDrawn = true;
        if (m_paintRect.isNull())
            m_painter->drawPixmap(m_option->rect.topLeft(), m_pixmap);
        else
            m_painter->drawPixmap(m_paintRect, m_pixmap);
    }
}